

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O1

int __thiscall Fl_Input::kf_move_down_and_eol(Fl_Input *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,(this->super_Fl_Input_).position_);
  iVar3 = (this->super_Fl_Input_).position_;
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,
                              (uint)(iVar3 < (this->super_Fl_Input_).size_ && iVar2 == iVar3) +
                              iVar3);
  iVar3 = iVar2;
  if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
    iVar3 = (this->super_Fl_Input_).mark_;
  }
  iVar3 = Fl_Input_::position(&this->super_Fl_Input_,iVar2,iVar3);
  bVar1 = Fl::option(OPTION_ARROW_FOCUS);
  return (uint)!bVar1 + iVar3;
}

Assistant:

int Fl_Input::kf_move_down_and_eol() {
  if (line_end(position())==position() && position()<size())
    return shift_position(line_end(position()+1)) + NORMAL_INPUT_MOVE;
  else
    return shift_position(line_end(position())) + NORMAL_INPUT_MOVE;
}